

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode parse_connect_to_slist(Curl_easy *data,connectdata *conn,curl_slist *conn_to_host)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  size_t max;
  byte *pbVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  byte *pbVar10;
  char *pcVar11;
  byte *__s;
  bool bVar12;
  char *local_38;
  
  if (conn_to_host == (curl_slist *)0x0) {
    return CURLE_OK;
  }
LAB_0044ef25:
  pcVar9 = conn_to_host->data;
  if (*pcVar9 == ':') {
LAB_0044efbd:
    if (pcVar9[1] != ':') {
      pcVar8 = strchr(pcVar9 + 1,0x3a);
      if (pcVar8 != (char *)0x0) {
        local_38 = (char *)0x0;
        lVar7 = strtol(pcVar9 + 1,&local_38,10);
        if ((local_38 == pcVar8) && (lVar7 == conn->remote_port)) {
          pcVar9 = pcVar8 + 1;
          goto LAB_0044efcb;
        }
      }
      goto LAB_0044f132;
    }
    pcVar9 = pcVar9 + 2;
LAB_0044efcb:
    if (*pcVar9 == '\0') goto LAB_0044f132;
    pbVar5 = (byte *)(*Curl_cstrdup)(pcVar9);
    if (pbVar5 == (byte *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    pbVar10 = pbVar5;
    __s = pbVar5;
    if (*pbVar5 == 0x5b) {
      pbVar10 = pbVar5 + 1;
      bVar2 = pbVar5[1];
      __s = pbVar10;
      while (bVar2 != 0) {
        iVar3 = Curl_isxdigit((uint)bVar2);
        if (((iVar3 == 0) && (bVar2 = *__s, bVar2 != 0x2e)) && (bVar2 != 0x3a)) {
          if (bVar2 != 0x25) goto LAB_0044f25e;
          uVar4 = (uint)__s[1];
          iVar3 = __s[1] - 0x32;
          if (iVar3 == 0) {
            iVar3 = 0x35 - (uint)__s[2];
          }
          else {
            iVar3 = -iVar3;
          }
          __s = __s + 1;
          if (iVar3 != 0) {
            Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
            uVar4 = (uint)*__s;
          }
          goto LAB_0044f21a;
        }
        pbVar1 = __s + 1;
        __s = __s + 1;
        bVar2 = *pbVar1;
      }
      goto LAB_0044f03b;
    }
    goto LAB_0044f04e;
  }
  bVar12 = (conn->bits).ipv6_ip != false;
  pcVar8 = "";
  pcVar11 = "";
  if (bVar12) {
    pcVar11 = "[";
  }
  if (bVar12) {
    pcVar8 = "]";
  }
  pcVar8 = curl_maprintf("%s%s%s",pcVar11,(conn->host).name,pcVar8);
  if (pcVar8 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  max = strlen(pcVar8);
  iVar3 = Curl_strncasecompare(pcVar9,pcVar8,max);
  (*Curl_cfree)(pcVar8);
  if ((iVar3 != 0) && (pcVar9[max] == ':')) {
    pcVar9 = pcVar9 + max;
    goto LAB_0044efbd;
  }
  goto LAB_0044f132;
LAB_0044f21a:
  if ((char)uVar4 == '\0') goto LAB_0044f03b;
  iVar3 = Curl_isalpha(uVar4);
  if (((iVar3 == 0) && (iVar3 = Curl_isxdigit((uint)*__s), iVar3 == 0)) &&
     ((bVar2 = *__s, 1 < bVar2 - 0x2d && ((bVar2 != 0x7e && (bVar2 != 0x5f)))))) goto LAB_0044f25e;
  uVar4 = (uint)__s[1];
  __s = __s + 1;
  goto LAB_0044f21a;
LAB_0044f25e:
  if (bVar2 == 0x5d) {
    *__s = 0;
    __s = __s + 1;
  }
  else {
LAB_0044f03b:
    Curl_infof(data,"Invalid IPv6 address format\n");
  }
LAB_0044f04e:
  pcVar9 = strchr((char *)__s,0x3a);
  if (pcVar9 == (char *)0x0) {
LAB_0044f174:
    uVar6 = 0xffffffff;
LAB_0044f17a:
    uVar4 = (uint)uVar6;
    pcVar9 = (*Curl_cstrdup)((char *)pbVar10);
    (*Curl_cfree)(pbVar5);
    if (pcVar9 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    if (*pcVar9 != '\0') {
      (conn->conn_to_host).rawalloc = pcVar9;
      (conn->conn_to_host).name = pcVar9;
      (conn->bits).conn_to_host = true;
      bVar2 = 0;
      Curl_infof(data,"Connecting to hostname: %s\n",pcVar9);
      goto LAB_0044f14b;
    }
  }
  else {
    local_38 = (char *)0x0;
    *pcVar9 = '\0';
    if (pcVar9[1] == '\0') goto LAB_0044f174;
    uVar6 = strtol(pcVar9 + 1,&local_38,10);
    if (((local_38 == (char *)0x0) || (*local_38 == '\0')) && (uVar6 < 0x10000)) goto LAB_0044f17a;
    Curl_infof(data,"No valid port number in connect to host string (%s)\n",pcVar9 + 1);
    (*Curl_cfree)(pbVar5);
LAB_0044f132:
    uVar4 = 0xffffffff;
    pcVar9 = (char *)0x0;
  }
  (conn->bits).conn_to_host = false;
  (*Curl_cfree)(pcVar9);
  bVar2 = 1;
LAB_0044f14b:
  if (-1 < (int)uVar4) {
    conn->conn_to_port = uVar4;
    (conn->bits).conn_to_port = true;
    Curl_infof(data,"Connecting to port: %d\n",(ulong)uVar4);
    return CURLE_OK;
  }
  (conn->bits).conn_to_port = false;
  conn_to_host = conn_to_host->next;
  if (!(bool)(bVar2 & conn_to_host != (curl_slist *)0x0)) {
    return CURLE_OK;
  }
  goto LAB_0044ef25;
}

Assistant:

static CURLcode parse_connect_to_slist(struct Curl_easy *data,
                                       struct connectdata *conn,
                                       struct curl_slist *conn_to_host)
{
  CURLcode result = CURLE_OK;
  char *host = NULL;
  int port = -1;

  while(conn_to_host && !host && port == -1) {
    result = parse_connect_to_string(data, conn, conn_to_host->data,
                                     &host, &port);
    if(result)
      return result;

    if(host && *host) {
      conn->conn_to_host.rawalloc = host;
      conn->conn_to_host.name = host;
      conn->bits.conn_to_host = TRUE;

      infof(data, "Connecting to hostname: %s\n", host);
    }
    else {
      /* no "connect to host" */
      conn->bits.conn_to_host = FALSE;
      Curl_safefree(host);
    }

    if(port >= 0) {
      conn->conn_to_port = port;
      conn->bits.conn_to_port = TRUE;
      infof(data, "Connecting to port: %d\n", port);
    }
    else {
      /* no "connect to port" */
      conn->bits.conn_to_port = FALSE;
      port = -1;
    }

    conn_to_host = conn_to_host->next;
  }

  return result;
}